

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

_Bool Curl_conn_data_pending(connectdata *conn,int sockindex)

{
  _Bool _Var1;
  int iVar2;
  _Bool _Var3;
  
  _Var1 = Curl_ssl_data_pending(conn,sockindex);
  _Var3 = true;
  if (!_Var1) {
    _Var1 = Curl_recv_has_postponed_data(conn,sockindex);
    if (!_Var1) {
      iVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,0);
      _Var3 = (_Bool)((byte)iVar2 & 0 < iVar2);
    }
  }
  return _Var3;
}

Assistant:

bool Curl_conn_data_pending(struct connectdata *conn, int sockindex)
{
  int readable;

  if(Curl_ssl_data_pending(conn, sockindex) ||
     Curl_recv_has_postponed_data(conn, sockindex))
    return true;

  readable = SOCKET_READABLE(conn->sock[sockindex], 0);
  return (readable > 0 && (readable & CURL_CSELECT_IN));
}